

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialaddress.cpp
# Opt level: O0

void __thiscall
ElementsConfidentialAddress_P2pkhAddress_Test::TestBody
          (ElementsConfidentialAddress_P2pkhAddress_Test *this)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_1648;
  Message local_1640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1618;
  undefined1 local_15f8 [8];
  AssertionResult gtest_ar_14;
  ElementsConfidentialAddress ca;
  AssertHelper local_1438;
  Message local_1430 [2];
  CfdException *anon_var_0;
  byte local_1269;
  char *pcStack_1268;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  string local_1258 [32];
  undefined1 local_1238 [8];
  ConfidentialKey uc_key;
  Message local_1218;
  Script local_1210;
  string local_11d8 [32];
  undefined1 local_11b8 [8];
  AssertionResult gtest_ar_13;
  Message local_11a0;
  AddressType local_1198 [2];
  undefined1 local_1190 [8];
  AssertionResult gtest_ar_12;
  Message local_1178;
  NetType local_1170 [2];
  undefined1 local_1168 [8];
  AssertionResult gtest_ar_11;
  AssertHelper local_1138;
  Message local_1130;
  string local_1128 [39];
  bool local_1101;
  undefined1 local_1100 [8];
  AssertionResult gtest_ar__1;
  Message local_10e8;
  Address local_10e0 [376];
  string local_f68 [32];
  undefined1 local_f48 [8];
  AssertionResult gtest_ar_10;
  Message local_f30;
  ByteData local_f28;
  string local_f10 [32];
  undefined1 local_ef0 [8];
  AssertionResult gtest_ar_9;
  Message local_ed8;
  Pubkey local_ed0;
  string local_eb8 [32];
  undefined1 local_e98 [8];
  AssertionResult gtest_ar_8;
  Message local_e80;
  string local_e78 [32];
  undefined1 local_e58 [8];
  AssertionResult gtest_ar_7;
  Message local_e40;
  ElementsConfidentialAddress local_e38 [432];
  vector local_c88 [24];
  Address local_c70 [376];
  AssertHelper local_af8;
  Message local_af0;
  Script local_ae8;
  string local_ab0 [32];
  undefined1 local_a90 [8];
  AssertionResult gtest_ar_6;
  Message local_a78;
  AddressType local_a70 [2];
  undefined1 local_a68 [8];
  AssertionResult gtest_ar_5;
  Message local_a50;
  NetType local_a48 [2];
  undefined1 local_a40 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_a10;
  Message local_a08;
  string local_a00 [39];
  bool local_9d9;
  undefined1 local_9d8 [8];
  AssertionResult gtest_ar_;
  Message local_9c0;
  Address local_9b8 [376];
  string local_840 [32];
  undefined1 local_820 [8];
  AssertionResult gtest_ar_3;
  Message local_808;
  ByteData local_800;
  string local_7e8 [32];
  undefined1 local_7c8 [8];
  AssertionResult gtest_ar_2;
  Message local_7b0;
  Pubkey local_7a8;
  string local_790 [32];
  undefined1 local_770 [8];
  AssertionResult gtest_ar_1;
  Message local_758;
  string local_750 [32];
  undefined1 local_730 [8];
  AssertionResult gtest_ar;
  Message local_718 [2];
  ElementsConfidentialAddress local_708 [432];
  vector local_558 [24];
  Address local_540 [376];
  Address local_3c8 [8];
  Address unblind_addr;
  ElementsConfidentialAddress local_250 [8];
  ElementsConfidentialAddress address;
  allocator local_99;
  string local_98 [32];
  undefined1 local_78 [8];
  ConfidentialKey key;
  allocator local_49;
  string local_48 [32];
  undefined1 local_28 [8];
  Pubkey pubkey;
  ElementsConfidentialAddress_P2pkhAddress_Test *this_local;
  
  pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_48,"027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af",&local_49
            );
  cfd::core::Pubkey::Pubkey((Pubkey *)local_28,local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_98,"02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16",&local_99
            );
  cfd::core::Pubkey::Pubkey((Pubkey *)local_78,local_98);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(local_250);
  cfd::core::Address::Address(local_3c8);
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address(local_540,kLiquidV1,(Pubkey *)local_28,local_558);
  cfd::core::Address::operator=(local_3c8,local_540);
  cfd::core::Address::~Address(local_540);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             local_558);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
                (local_708,local_3c8,(Pubkey *)local_78);
      cfd::core::ElementsConfidentialAddress::operator=(local_250,local_708);
      cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(local_708);
    }
  }
  else {
    testing::Message::Message(local_718);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x37,
               "Expected: (address = ElementsConfidentialAddress(unblind_addr, key)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_718);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(local_718);
  }
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_730,
             "\"VTpyoufXeg8LByRmUeHt1zyzFm1RjEP7PvWYHsjGtj9Ef1ibxgVoGkPsUPDNvkKog17K7Qn5eQ3B7g9w\"",
             "address.GetAddress().c_str()",
             "VTpyoufXeg8LByRmUeHt1zyzFm1RjEP7PvWYHsjGtj9Ef1ibxgVoGkPsUPDNvkKog17K7Qn5eQ3B7g9w",
             pcVar3);
  std::__cxx11::string::~string(local_750);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_730);
  if (!bVar1) {
    testing::Message::Message(&local_758);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_730);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x3a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_758);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_758);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_730);
  cfd::core::ElementsConfidentialAddress::GetConfidentialKey();
  cfd::core::Pubkey::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_770,
             "\"02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16\"",
             "address.GetConfidentialKey().GetHex().c_str()",
             "02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16",pcVar3);
  std::__cxx11::string::~string(local_790);
  cfd::core::Pubkey::~Pubkey(&local_7a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_770);
  if (!bVar1) {
    testing::Message::Message(&local_7b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_770);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x3d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_7b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_7b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_770);
  cfd::core::ElementsConfidentialAddress::GetHash();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_7c8,"\"925d4028880bd0c9d68fbc7fc7dfee976698629c\"",
             "address.GetHash().GetHex().c_str()","925d4028880bd0c9d68fbc7fc7dfee976698629c",pcVar3)
  ;
  std::__cxx11::string::~string(local_7e8);
  cfd::core::ByteData::~ByteData(&local_800);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7c8);
  if (!bVar1) {
    testing::Message::Message(&local_808);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_7c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x3f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_808);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_808);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7c8);
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress();
  cfd::core::Address::GetAddress_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_820,"\"QAcHVN55oetZU3wXXxnTrYHaqVUe35UhwJ\"",
             "address.GetUnblindedAddress().GetAddress().c_str()",
             "QAcHVN55oetZU3wXXxnTrYHaqVUe35UhwJ",pcVar3);
  std::__cxx11::string::~string(local_840);
  cfd::core::Address::~Address(local_9b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_820);
  if (!bVar1) {
    testing::Message::Message(&local_9c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_820);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x41,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_9c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_9c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_820);
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_();
  bVar2 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress(local_a00);
  local_9d9 = (bool)(bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_9d8,&local_9d9,(type *)0x0);
  std::__cxx11::string::~string(local_a00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9d8);
  if (!bVar1) {
    testing::Message::Message(&local_a08);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_4.message_,(internal *)local_9d8,
               (AssertionResult *)
               "ElementsConfidentialAddress::IsConfidentialAddress(address.GetAddress())","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x43,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a10,&local_a08);
    testing::internal::AssertHelper::~AssertHelper(&local_a10);
    std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_a08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9d8);
  local_a48[1] = 3;
  local_a48[0] = cfd::core::ElementsConfidentialAddress::GetNetType();
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            ((EqHelper<false> *)local_a40,"ElementsNetType::kLiquidV1","address.GetNetType()",
             local_a48 + 1,local_a48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a40);
  if (!bVar1) {
    testing::Message::Message(&local_a50);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x44,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_a50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_a50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a40);
  local_a70[1] = 2;
  local_a70[0] = cfd::core::ElementsConfidentialAddress::GetAddressType();
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            ((EqHelper<false> *)local_a68,"ElementsAddressType::kP2pkhAddress",
             "address.GetAddressType()",local_a70 + 1,local_a70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a68);
  if (!bVar1) {
    testing::Message::Message(&local_a78);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x45,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_a78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_a78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a68);
  cfd::core::ElementsConfidentialAddress::GetLockingScript();
  cfd::core::Script::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_a90,"\"76a914925d4028880bd0c9d68fbc7fc7dfee976698629c88ac\"",
             "address.GetLockingScript().GetHex().c_str()",
             "76a914925d4028880bd0c9d68fbc7fc7dfee976698629c88ac",pcVar3);
  std::__cxx11::string::~string(local_ab0);
  cfd::core::Script::~Script(&local_ae8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a90);
  if (!bVar1) {
    testing::Message::Message(&local_af0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a90);
    testing::internal::AssertHelper::AssertHelper
              (&local_af8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x47,pcVar3);
    testing::internal::AssertHelper::operator=(&local_af8,&local_af0);
    testing::internal::AssertHelper::~AssertHelper(&local_af8);
    testing::Message::~Message(&local_af0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a90);
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address(local_c70,kElementsRegtest,(Pubkey *)local_28,local_c88);
  cfd::core::Address::operator=(local_3c8,local_c70);
  cfd::core::Address::~Address(local_c70);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             local_c88);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
                (local_e38,local_3c8,(Pubkey *)local_78);
      cfd::core::ElementsConfidentialAddress::operator=(local_250,local_e38);
      cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(local_e38);
    }
  }
  else {
    testing::Message::Message(&local_e40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x4a,
               "Expected: (address = ElementsConfidentialAddress(unblind_addr, key)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_e40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_e40);
  }
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_e58,
             "\"CTEqTvCZtF8yBn4JeRxJKDjsVWk7m9mMuzThGzwTgn9G8cLBqjmqc5YkyheitzBooX7XBVNmAS34Be8o\"",
             "address.GetAddress().c_str()",
             "CTEqTvCZtF8yBn4JeRxJKDjsVWk7m9mMuzThGzwTgn9G8cLBqjmqc5YkyheitzBooX7XBVNmAS34Be8o",
             pcVar3);
  std::__cxx11::string::~string(local_e78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e58);
  if (!bVar1) {
    testing::Message::Message(&local_e80);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x4d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_e80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_e80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e58);
  cfd::core::ElementsConfidentialAddress::GetConfidentialKey();
  cfd::core::Pubkey::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_e98,
             "\"02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16\"",
             "address.GetConfidentialKey().GetHex().c_str()",
             "02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16",pcVar3);
  std::__cxx11::string::~string(local_eb8);
  cfd::core::Pubkey::~Pubkey(&local_ed0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e98);
  if (!bVar1) {
    testing::Message::Message(&local_ed8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x50,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_ed8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_ed8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e98);
  cfd::core::ElementsConfidentialAddress::GetHash();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_ef0,"\"925d4028880bd0c9d68fbc7fc7dfee976698629c\"",
             "address.GetHash().GetHex().c_str()","925d4028880bd0c9d68fbc7fc7dfee976698629c",pcVar3)
  ;
  std::__cxx11::string::~string(local_f10);
  cfd::core::ByteData::~ByteData(&local_f28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ef0);
  if (!bVar1) {
    testing::Message::Message(&local_f30);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_ef0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x52,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_f30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_f30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ef0);
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress();
  cfd::core::Address::GetAddress_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_f48,"\"2dnmekh8NBmNX3Ckwte5CArjcsHLYdthCg3\"",
             "address.GetUnblindedAddress().GetAddress().c_str()",
             "2dnmekh8NBmNX3Ckwte5CArjcsHLYdthCg3",pcVar3);
  std::__cxx11::string::~string(local_f68);
  cfd::core::Address::~Address(local_10e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f48);
  if (!bVar1) {
    testing::Message::Message(&local_10e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x54,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_10e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_10e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f48);
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_();
  bVar2 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress(local_1128);
  local_1101 = (bool)(bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1100,&local_1101,(type *)0x0);
  std::__cxx11::string::~string(local_1128);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1100);
  if (!bVar1) {
    testing::Message::Message(&local_1130);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_11.message_,(internal *)local_1100,
               (AssertionResult *)
               "ElementsConfidentialAddress::IsConfidentialAddress(address.GetAddress())","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x56,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1138,&local_1130);
    testing::internal::AssertHelper::~AssertHelper(&local_1138);
    std::__cxx11::string::~string((string *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_1130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1100);
  local_1170[1] = 4;
  local_1170[0] = cfd::core::ElementsConfidentialAddress::GetNetType();
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            ((EqHelper<false> *)local_1168,"ElementsNetType::kElementsRegtest",
             "address.GetNetType()",local_1170 + 1,local_1170);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1168);
  if (!bVar1) {
    testing::Message::Message(&local_1178);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x57,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_1178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_1178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1168);
  local_1198[1] = 2;
  local_1198[0] = cfd::core::ElementsConfidentialAddress::GetAddressType();
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            ((EqHelper<false> *)local_1190,"ElementsAddressType::kP2pkhAddress",
             "address.GetAddressType()",local_1198 + 1,local_1198);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1190);
  if (!bVar1) {
    testing::Message::Message(&local_11a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1190);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x58,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_11a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_11a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1190);
  cfd::core::ElementsConfidentialAddress::GetLockingScript();
  cfd::core::Script::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_11b8,"\"76a914925d4028880bd0c9d68fbc7fc7dfee976698629c88ac\"",
             "address.GetLockingScript().GetHex().c_str()",
             "76a914925d4028880bd0c9d68fbc7fc7dfee976698629c88ac",pcVar3);
  std::__cxx11::string::~string(local_11d8);
  cfd::core::Script::~Script(&local_1210);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11b8);
  if (!bVar1) {
    testing::Message::Message(&local_1218);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_11b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &uc_key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x5a,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &uc_key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1218);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &uc_key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_1218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1258,
             "04d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16e50cd61e20eb14e59a0c763d9cda790becb868ceeb00e5f74da0d15ff8381534"
             ,(allocator *)((long)&gtest_msg.value + 7));
  cfd::core::Pubkey::Pubkey((Pubkey *)local_1238,local_1258);
  std::__cxx11::string::~string(local_1258);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffed98,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffed98);
  if (bVar1) {
    local_1269 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
                ((ElementsConfidentialAddress *)&anon_var_0,local_3c8,(Pubkey *)local_1238);
      cfd::core::ElementsConfidentialAddress::operator=
                (local_250,(ElementsConfidentialAddress *)&anon_var_0);
      cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
                ((ElementsConfidentialAddress *)&anon_var_0);
    }
    if ((local_1269 & 1) != 0) goto LAB_004201aa;
    pcStack_1268 = 
    "Expected: (address = ElementsConfidentialAddress(unblind_addr, uc_key)) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_1430);
  testing::internal::AssertHelper::AssertHelper
            (&local_1438,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
             ,0x61,pcStack_1268);
  testing::internal::AssertHelper::operator=(&local_1438,local_1430);
  testing::internal::AssertHelper::~AssertHelper(&local_1438);
  testing::Message::~Message(local_1430);
LAB_004201aa:
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)&gtest_ar_14.message_,local_250);
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_();
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_15f8,"address.GetAddress()","ca.GetAddress()",&local_1618,
             &local_1638);
  std::__cxx11::string::~string((string *)&local_1638);
  std::__cxx11::string::~string((string *)&local_1618);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_15f8);
  if (!bVar1) {
    testing::Message::Message(&local_1640);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_15f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1648,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x65,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1648,&local_1640);
    testing::internal::AssertHelper::~AssertHelper(&local_1648);
    testing::Message::~Message(&local_1640);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_15f8);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)&gtest_ar_14.message_);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_1238);
  cfd::core::Address::~Address(local_3c8);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(local_250);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_78);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_28);
  return;
}

Assistant:

TEST(ElementsConfidentialAddress, P2pkhAddress) {
  const Pubkey pubkey = Pubkey(
      "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");
  ConfidentialKey key = ConfidentialKey(
      "02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16");
  ElementsConfidentialAddress address;
  Address unblind_addr;

  unblind_addr = Address(ElementsNetType::kLiquidV1, pubkey, GetElementsAddressFormatList());
  EXPECT_NO_THROW((address = ElementsConfidentialAddress(unblind_addr, key)));
  EXPECT_STREQ(
      "VTpyoufXeg8LByRmUeHt1zyzFm1RjEP7PvWYHsjGtj9Ef1ibxgVoGkPsUPDNvkKog17K7Qn5eQ3B7g9w",
      address.GetAddress().c_str());
  EXPECT_STREQ(
      "02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16",
      address.GetConfidentialKey().GetHex().c_str());
  EXPECT_STREQ("925d4028880bd0c9d68fbc7fc7dfee976698629c",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("QAcHVN55oetZU3wXXxnTrYHaqVUe35UhwJ",
               address.GetUnblindedAddress().GetAddress().c_str());
  EXPECT_TRUE(
      ElementsConfidentialAddress::IsConfidentialAddress(address.GetAddress()));
  EXPECT_EQ(ElementsNetType::kLiquidV1, address.GetNetType());
  EXPECT_EQ(ElementsAddressType::kP2pkhAddress, address.GetAddressType());
  EXPECT_STREQ("76a914925d4028880bd0c9d68fbc7fc7dfee976698629c88ac",
               address.GetLockingScript().GetHex().c_str());

  unblind_addr = Address(ElementsNetType::kElementsRegtest, pubkey, GetElementsAddressFormatList());
  EXPECT_NO_THROW((address = ElementsConfidentialAddress(unblind_addr, key)));
  EXPECT_STREQ(
      "CTEqTvCZtF8yBn4JeRxJKDjsVWk7m9mMuzThGzwTgn9G8cLBqjmqc5YkyheitzBooX7XBVNmAS34Be8o",
      address.GetAddress().c_str());
  EXPECT_STREQ(
      "02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16",
      address.GetConfidentialKey().GetHex().c_str());
  EXPECT_STREQ("925d4028880bd0c9d68fbc7fc7dfee976698629c",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("2dnmekh8NBmNX3Ckwte5CArjcsHLYdthCg3",
               address.GetUnblindedAddress().GetAddress().c_str());
  EXPECT_TRUE(
      ElementsConfidentialAddress::IsConfidentialAddress(address.GetAddress()));
  EXPECT_EQ(ElementsNetType::kElementsRegtest, address.GetNetType());
  EXPECT_EQ(ElementsAddressType::kP2pkhAddress, address.GetAddressType());
  EXPECT_STREQ("76a914925d4028880bd0c9d68fbc7fc7dfee976698629c88ac",
               address.GetLockingScript().GetHex().c_str());

  // uncompress pubkey
  ConfidentialKey uc_key =
      ConfidentialKey(
          "04d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16e50cd61e20eb14e59a0c763d9cda790becb868ceeb00e5f74da0d15ff8381534");
  EXPECT_THROW((address = ElementsConfidentialAddress(unblind_addr, uc_key)),
               CfdException);

  // copy check
  ElementsConfidentialAddress ca(address);
  EXPECT_EQ(address.GetAddress(), ca.GetAddress());
}